

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall
pbrt::FormattingScene::MediumInterface
          (FormattingScene *this,string *insideName,string *outsideName,FileLoc loc)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct
            ((ulong)&local_40,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
  Printf<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const&>
            ("%sMediumInterface \"%s\" \"%s\"\n",&local_40,insideName,outsideName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FormattingScene::MediumInterface(const std::string &insideName,
                                      const std::string &outsideName, FileLoc loc) {
    Printf("%sMediumInterface \"%s\" \"%s\"\n", indent(), insideName, outsideName);
}